

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

void av1_rc_compute_frame_size_bounds
               (AV1_COMP *cpi,int frame_target,int *frame_under_shoot_limit,
               int *frame_over_shoot_limit)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
    *frame_under_shoot_limit = 0;
    iVar3 = 0x7fffffff;
  }
  else {
    uVar4 = (long)(cpi->sf).hl_sf.recode_tolerance * (long)frame_target;
    iVar1 = 100;
    if (9999 < (long)uVar4) {
      iVar1 = (int)(uVar4 / 100);
    }
    iVar3 = 0;
    if (0 < frame_target - iVar1) {
      iVar3 = frame_target - iVar1;
    }
    *frame_under_shoot_limit = iVar3;
    lVar2 = (long)iVar1 + (long)frame_target;
    iVar1 = (cpi->rc).max_frame_bandwidth;
    iVar3 = (int)lVar2;
    if (iVar1 <= lVar2) {
      iVar3 = iVar1;
    }
  }
  *frame_over_shoot_limit = iVar3;
  return;
}

Assistant:

void av1_rc_compute_frame_size_bounds(const AV1_COMP *cpi, int frame_target,
                                      int *frame_under_shoot_limit,
                                      int *frame_over_shoot_limit) {
  if (cpi->oxcf.rc_cfg.mode == AOM_Q) {
    *frame_under_shoot_limit = 0;
    *frame_over_shoot_limit = INT_MAX;
  } else {
    // For very small rate targets where the fractional adjustment
    // may be tiny make sure there is at least a minimum range.
    assert(cpi->sf.hl_sf.recode_tolerance <= 100);
    const int tolerance = (int)AOMMAX(
        100, ((int64_t)cpi->sf.hl_sf.recode_tolerance * frame_target) / 100);
    *frame_under_shoot_limit = AOMMAX(frame_target - tolerance, 0);
    *frame_over_shoot_limit = (int)AOMMIN((int64_t)frame_target + tolerance,
                                          cpi->rc.max_frame_bandwidth);
  }
}